

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void av1_rd_pick_inter_mode_sb_seg_skip
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
               RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,int64_t best_rd_so_far)

{
  int32_t *piVar1;
  byte segment_id_00;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int_mv iVar5;
  int_interpfilters use_adaptive_rd_thresh;
  WarpedMotionParams *gm;
  long lVar6;
  long in_RDX;
  long in_RDI;
  int *in_R9;
  BLOCK_SIZE in_stack_00000008;
  long in_stack_00000018;
  int best_rs;
  int rs;
  InterpFilter interp_filter;
  int pts_inref [16];
  int pts [16];
  int64_t distortion2;
  int rate2;
  int64_t this_rd;
  InterpFilter best_filter;
  int *comp_inter_cost;
  ModeCosts *mode_costs;
  uint ref_costs_comp [8] [8];
  uint ref_costs_single [8];
  int i;
  int comp_pred;
  uchar segment_id;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  FeatureFlags *features;
  AV1_COMMON *cm;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  int in_stack_fffffffffffffd88;
  InterpFilter in_stack_fffffffffffffd8f;
  undefined4 in_stack_fffffffffffffd90;
  int in_stack_fffffffffffffd94;
  MACROBLOCK *in_stack_fffffffffffffd98;
  MACROBLOCK *x_00;
  MACROBLOCK *in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffdb0;
  THR_MODES in_stack_fffffffffffffdb1;
  THR_MODES in_stack_fffffffffffffdb2;
  BLOCK_SIZE in_stack_fffffffffffffdb3;
  undefined4 in_stack_fffffffffffffdb4;
  int_interpfilters in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 uVar7;
  THR_MODES in_stack_fffffffffffffdd0;
  THR_MODES in_stack_fffffffffffffdd8;
  THR_MODES in_stack_fffffffffffffde0;
  uint (*in_stack_fffffffffffffdf8) [8];
  uint *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  ModeCosts *in_stack_fffffffffffffe10;
  MACROBLOCKD *in_stack_fffffffffffffe18;
  AV1_COMMON *in_stack_fffffffffffffe20;
  int *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  AV1_COMMON *cm_00;
  int local_19c;
  InterpFilter local_189;
  int local_74;
  int local_54;
  
  x_00 = (MACROBLOCK *)**(undefined8 **)(in_RDX + 0x2058);
  segment_id_00 = (byte)*(undefined2 *)((long)&x_00->plane[1].coeff + 7) & 7;
  gm = (WarpedMotionParams *)(in_RDX + 0x8000);
  iVar3 = av1_get_reference_mode_context
                    ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  piVar1 = gm->wmmat;
  cm_00 = (AV1_COMMON *)0x0;
  av1_collect_neighbors_ref_counts
            ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  estimate_ref_frame_costs
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe0c,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
    *(undefined4 *)(in_RDX + 0x25660 + (long)local_54 * 4) = 0x7fffffff;
  }
  for (local_54 = 1; local_54 < 8; local_54 = local_54 + 1) {
    *(undefined4 *)(in_RDX + 0x15d70 + (long)local_54 * 4) = 0x7fffffff;
  }
  *in_R9 = 0x7fffffff;
  *(uint8_t *)((long)&x_00->plane[1].src_diff + 6) = '\0';
  *(uint8_t *)((long)&x_00->plane[1].src_diff + 7) = '\0';
  *(uint8_t *)((long)&x_00->plane[0].round_fp_QTX + 3) = '\0';
  *(PREDICTION_MODE *)((long)&x_00->plane[0].src_diff + 2) = '\x0f';
  *(MOTION_MODE *)&x_00->plane[0].coeff = '\0';
  *(UV_PREDICTION_MODE *)((long)&x_00->plane[0].src_diff + 3) = '\0';
  iVar4 = segfeature_active((segmentation *)(in_RDI + 0x409b8),segment_id_00,'\x05');
  if (iVar4 == 0) {
    *(MV_REFERENCE_FRAME *)&x_00->plane[0].qcoeff = '\x01';
  }
  else {
    iVar4 = get_segdata((segmentation *)(in_RDI + 0x409b8),(uint)segment_id_00,'\x05');
    *(MV_REFERENCE_FRAME *)&x_00->plane[0].qcoeff = (MV_REFERENCE_FRAME)iVar4;
  }
  *(MV_REFERENCE_FRAME *)((long)&x_00->plane[0].qcoeff + 1) = -1;
  iVar5 = gm_get_motion_vector
                    (gm,(int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                     (BLOCK_SIZE)((ulong)in_stack_fffffffffffffda0 >> 0x18),
                     (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),(int)in_stack_fffffffffffffd98,
                     in_stack_fffffffffffffd94);
  *(int_mv *)&x_00->plane[0].dqcoeff = iVar5;
  *(TX_SIZE *)((long)&x_00->plane[1].dqcoeff + 1) = ""[in_stack_00000008];
  *(undefined1 *)(in_RDX + 0x24e08) = 1;
  *(ushort *)((long)&x_00->plane[1].coeff + 7) =
       *(ushort *)((long)&x_00->plane[1].coeff + 7) & 0xffcf;
  *(MOTION_MODE *)&x_00->plane[0].coeff = '\0';
  av1_count_overlappable_neighbors
            ((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  iVar4 = is_motion_variation_allowed_bsize(in_stack_00000008);
  if ((iVar4 != 0) && (iVar4 = has_second_ref((MB_MODE_INFO *)x_00), iVar4 == 0)) {
    uVar2 = av1_findSamples(cm_00,(MACROBLOCKD *)CONCAT44(iVar5.as_int,in_stack_fffffffffffffe50),
                            in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    *(uint8_t *)((long)&x_00->plane[0].coeff + 1) = uVar2;
    if (1 < *(uint8_t *)((long)&x_00->plane[0].coeff + 1)) {
      uVar2 = av1_selectSamples((MV *)CONCAT44(in_stack_fffffffffffffdb4,
                                               CONCAT13(in_stack_fffffffffffffdb3,
                                                        CONCAT12(in_stack_fffffffffffffdb2,
                                                                 CONCAT11(in_stack_fffffffffffffdb1,
                                                                          in_stack_fffffffffffffdb0)
                                                                ))),gm->wmmat,
                                (int *)in_stack_fffffffffffffda0,
                                (int)((ulong)in_stack_fffffffffffffd98 >> 0x20),
                                (BLOCK_SIZE)((ulong)in_stack_fffffffffffffd98 >> 0x18));
      *(uint8_t *)((long)&x_00->plane[0].coeff + 1) = uVar2;
    }
  }
  uVar7 = CONCAT13(*(undefined1 *)(in_RDI + 0x3c179),(int3)in_stack_fffffffffffffdc4);
  set_default_interp_filters
            ((MB_MODE_INFO *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             (InterpFilter)((uint)in_stack_fffffffffffffd7c >> 0x18));
  local_189 = (InterpFilter)((uint)uVar7 >> 0x18);
  if (local_189 == MULTITAP_SHARP2) {
    local_189 = EIGHTTAP_REGULAR;
    iVar4 = av1_is_interp_needed
                      ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))
    ;
    if (iVar4 != 0) {
      in_stack_fffffffffffffdbc = 0x7fffffff;
      for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
        in_stack_fffffffffffffda0 = x_00;
        in_stack_fffffffffffffdb8 = av1_broadcast_interp_filter((InterpFilter)local_54);
        *(int_interpfilters *)((long)&in_stack_fffffffffffffda0->plane[0].qcoeff + 4) =
             in_stack_fffffffffffffdb8;
        in_stack_fffffffffffffdc0 =
             av1_get_switchable_rate
                       (in_stack_fffffffffffffd98,
                        (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)
                        ,in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88);
        if (in_stack_fffffffffffffdc0 < in_stack_fffffffffffffdbc) {
          local_189 = (InterpFilter)
                      (((int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4))->as_filters).
                      y_filter;
          in_stack_fffffffffffffdbc = in_stack_fffffffffffffdc0;
        }
      }
    }
  }
  use_adaptive_rd_thresh = av1_broadcast_interp_filter(local_189);
  *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4) = use_adaptive_rd_thresh;
  local_19c = av1_get_switchable_rate
                        (x_00,(MACROBLOCKD *)
                              CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                         in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88);
  if (*(char *)(in_RDI + 0x3bf81) == '\x02') {
    local_19c = piVar1[(long)iVar3 * 2] + local_19c;
  }
  lVar6 = (long)(local_74 + local_19c) * (long)*(int *)(in_RDX + 0x4218) + 0x100 >> 9;
  *in_R9 = local_74 + local_19c;
  in_R9[2] = 0;
  in_R9[3] = 0;
  *(long *)(in_R9 + 4) = lVar6;
  if (lVar6 < in_stack_00000018) {
    if (*(int *)(in_RDI + 0x60a88) != 0) {
      av1_update_rd_thresh_fact
                ((AV1_COMMON *)CONCAT44(uVar7,in_stack_fffffffffffffdc0),
                 (int (*) [169])CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8.as_int)
                 ,use_adaptive_rd_thresh.as_int,in_stack_fffffffffffffdb3,in_stack_fffffffffffffdb2,
                 in_stack_fffffffffffffdb1,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffde0);
    }
    store_coding_context
              (in_stack_fffffffffffffda0,(PICK_MODE_CONTEXT *)x_00,in_stack_fffffffffffffd94);
  }
  else {
    *in_R9 = 0x7fffffff;
    in_R9[4] = -1;
    in_R9[5] = 0x7fffffff;
  }
  return;
}

Assistant:

void av1_rd_pick_inter_mode_sb_seg_skip(const AV1_COMP *cpi,
                                        TileDataEnc *tile_data, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                        PICK_MODE_CONTEXT *ctx,
                                        int64_t best_rd_so_far) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  unsigned char segment_id = mbmi->segment_id;
  const int comp_pred = 0;
  int i;
  unsigned int ref_costs_single[REF_FRAMES];
  unsigned int ref_costs_comp[REF_FRAMES][REF_FRAMES];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *comp_inter_cost =
      mode_costs->comp_inter_cost[av1_get_reference_mode_context(xd)];
  InterpFilter best_filter = SWITCHABLE;
  int64_t this_rd = INT64_MAX;
  int rate2 = 0;
  const int64_t distortion2 = 0;
  (void)mi_row;
  (void)mi_col;
  (void)tile_data;

  av1_collect_neighbors_ref_counts(xd);

  estimate_ref_frame_costs(cm, xd, mode_costs, segment_id, ref_costs_single,
                           ref_costs_comp);

  for (i = 0; i < REF_FRAMES; ++i) x->pred_sse[i] = INT_MAX;
  for (i = LAST_FRAME; i < REF_FRAMES; ++i) x->pred_mv_sad[i] = INT_MAX;

  rd_cost->rate = INT_MAX;

  assert(segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP));

  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mode = GLOBALMV;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->uv_mode = UV_DC_PRED;
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME))
    mbmi->ref_frame[0] = get_segdata(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  else
    mbmi->ref_frame[0] = LAST_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->mv[0].as_int =
      gm_get_motion_vector(&cm->global_motion[mbmi->ref_frame[0]],
                           features->allow_high_precision_mv, bsize, mi_col,
                           mi_row, features->cur_frame_force_integer_mv)
          .as_int;
  mbmi->tx_size = max_txsize_lookup[bsize];
  x->txfm_search_info.skip_txfm = 1;

  mbmi->ref_mv_idx = 0;

  mbmi->motion_mode = SIMPLE_TRANSLATION;
  av1_count_overlappable_neighbors(cm, xd);
  if (is_motion_variation_allowed_bsize(bsize) && !has_second_ref(mbmi)) {
    int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
    mbmi->num_proj_ref = av1_findSamples(cm, xd, pts, pts_inref);
    // Select the samples according to motion vector difference
    if (mbmi->num_proj_ref > 1) {
      mbmi->num_proj_ref = av1_selectSamples(&mbmi->mv[0].as_mv, pts, pts_inref,
                                             mbmi->num_proj_ref, bsize);
    }
  }

  const InterpFilter interp_filter = features->interp_filter;
  set_default_interp_filters(mbmi, interp_filter);

  if (interp_filter != SWITCHABLE) {
    best_filter = interp_filter;
  } else {
    best_filter = EIGHTTAP_REGULAR;
    if (av1_is_interp_needed(xd)) {
      int rs;
      int best_rs = INT_MAX;
      for (i = 0; i < SWITCHABLE_FILTERS; ++i) {
        mbmi->interp_filters = av1_broadcast_interp_filter(i);
        rs = av1_get_switchable_rate(x, xd, interp_filter,
                                     cm->seq_params->enable_dual_filter);
        if (rs < best_rs) {
          best_rs = rs;
          best_filter = mbmi->interp_filters.as_filters.y_filter;
        }
      }
    }
  }
  // Set the appropriate filter
  mbmi->interp_filters = av1_broadcast_interp_filter(best_filter);
  rate2 += av1_get_switchable_rate(x, xd, interp_filter,
                                   cm->seq_params->enable_dual_filter);

  if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT)
    rate2 += comp_inter_cost[comp_pred];

  // Estimate the reference frame signaling cost and add it
  // to the rolling cost variable.
  rate2 += ref_costs_single[LAST_FRAME];
  this_rd = RDCOST(x->rdmult, rate2, distortion2);

  rd_cost->rate = rate2;
  rd_cost->dist = distortion2;
  rd_cost->rdcost = this_rd;

  if (this_rd >= best_rd_so_far) {
    rd_cost->rate = INT_MAX;
    rd_cost->rdcost = INT64_MAX;
    return;
  }

  assert((interp_filter == SWITCHABLE) ||
         (interp_filter == mbmi->interp_filters.as_filters.y_filter));

  if (cpi->sf.inter_sf.adaptive_rd_thresh) {
    av1_update_rd_thresh_fact(cm, x->thresh_freq_fact,
                              cpi->sf.inter_sf.adaptive_rd_thresh, bsize,
                              THR_GLOBALMV, THR_INTER_MODE_START,
                              THR_INTER_MODE_END, THR_DC, MAX_MODES);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context(x, ctx, THR_GLOBALMV, 0);
#else
  store_coding_context(x, ctx, 0);
#endif  // CONFIG_INTERNAL_STATS
}